

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void endElementNsSplit(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  xmlSchemaSAXPlugPtr ctxt;
  xmlChar *URI_local;
  xmlChar *prefix_local;
  xmlChar *localname_local;
  void *ctx_local;
  
  if (ctx != (void *)0x0) {
    if ((*(long *)((long)ctx + 0x10) != 0) && (*(long *)(*(long *)((long)ctx + 0x10) + 0xf0) != 0))
    {
      (**(code **)(*(long *)((long)ctx + 0x10) + 0xf0))
                (*(undefined8 *)((long)ctx + 0x20),localname,prefix,URI);
    }
    if (*(long *)((long)ctx + 0x128) != 0) {
      xmlSchemaSAXHandleEndElementNs(*(void **)((long)ctx + 0x128),localname,prefix,URI);
    }
  }
  return;
}

Assistant:

static void
endElementNsSplit(void *ctx, const xmlChar * localname,
		    const xmlChar * prefix, const xmlChar * URI) {
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if (ctxt == NULL)
        return;
    if ((ctxt->user_sax != NULL) &&
        (ctxt->user_sax->endElementNs != NULL))
	ctxt->user_sax->endElementNs(ctxt->user_data, localname, prefix, URI);
    if (ctxt->ctxt != NULL)
	xmlSchemaSAXHandleEndElementNs(ctxt->ctxt, localname, prefix, URI);
}